

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

void __thiscall kj::Path::evalPart(Path *this,Vector<kj::String> *parts,ArrayPtr<const_char> part)

{
  String *pSVar1;
  Fault FVar2;
  Exception *pEVar3;
  ArrayDisposer *pAVar4;
  String *pSVar5;
  char *size;
  size_t newSize;
  Fault FVar6;
  char *ptrCopy;
  Fault f;
  Exception *pEStack_a0;
  ArrayDisposer *local_98;
  Fault f_1;
  DebugComparison<unsigned_long,_int> _kjCondition;
  String local_58;
  String local_38;
  
  pAVar4 = local_98;
  pEVar3 = pEStack_a0;
  size = part.ptr;
  if (size != (char *)0x0) {
    if (size == (char *)0x2) {
      if ((*(char *)&(parts->builder).ptr == '.') &&
         (*(char *)((long)&(parts->builder).ptr + 1) == '.')) {
        pSVar5 = (String *)(this->parts).size_;
        pSVar1 = (this->parts).ptr;
        _kjCondition.left = ((long)pSVar5 - (long)pSVar1 >> 3) * -0x5555555555555555;
        _kjCondition._8_8_ = _kjCondition._8_8_ & 0xffffffff00000000;
        _kjCondition.op.content.ptr = " > ";
        _kjCondition.op.content.size_ = 4;
        _kjCondition.result = pSVar5 != pSVar1;
        if (!_kjCondition.result) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,int>&,char_const(&)[50]>
                    (&f,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                     ,0x13f,FAILED,"parts.size() > 0",
                     "_kjCondition,\"can\'t use \\\"..\\\" to break out of starting directory\"",
                     &_kjCondition,
                     (char (*) [50])"can\'t use \"..\" to break out of starting directory");
          kj::_::Debug::Fault::~Fault(&f);
          return;
        }
        ArrayBuilder<kj::String>::removeLast((ArrayBuilder<kj::String> *)this);
        return;
      }
    }
    else if ((size == (char *)0x1) && (*(char *)&(parts->builder).ptr == '.')) {
      return;
    }
    heapString((String *)&f,(char *)parts,(size_t)size);
    FVar6.exception = pEStack_a0;
    if (pEStack_a0 != (Exception *)0x0) {
      FVar6 = f;
    }
    _kjCondition.left = strlen((char *)FVar6.exception);
    _kjCondition._8_8_ = (undefined1 *)0x0;
    if (pEStack_a0 != (Exception *)0x0) {
      _kjCondition._8_8_ = (undefined1 *)((long)&pEStack_a0[-1].details.builder.disposer + 7);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == _kjCondition._8_8_;
    if (!_kjCondition.result) {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[32],kj::String&>
                (&f_1,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x146,FAILED,"strlen(str.begin()) == str.size()",
                 "_kjCondition,\"NUL character in path component\", str",
                 (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
                 (char (*) [32])"NUL character in path component",(String *)&f);
      FVar6 = f;
      local_38.content.ptr = (char *)f.exception;
      local_38.content.size_ = (size_t)pEStack_a0;
      f.exception = (Exception *)0x0;
      stripNul(&local_58,&local_38);
      FVar2 = f;
      if (f.exception != (Exception *)0x0) {
        f.exception = (Exception *)0x0;
        (**local_98->_vptr_ArrayDisposer)(local_98,FVar2.exception,1,0,0,0);
      }
      f.exception = (Exception *)local_58.content.ptr;
      pEStack_a0 = (Exception *)local_58.content.size_;
      local_98 = local_58.content.disposer;
      local_58.content.ptr = (char *)0x0;
      local_58.content.size_ = 0;
      if (FVar6.exception != (Exception *)0x0) {
        local_38.content.ptr = (char *)0x0;
        local_38.content.size_ = 0;
        (**pAVar4->_vptr_ArrayDisposer)(pAVar4,FVar6.exception,1,pEVar3,pEVar3,0);
      }
      kj::_::Debug::Fault::~Fault(&f_1);
    }
    pSVar5 = (String *)(this->parts).size_;
    if (pSVar5 == (String *)(this->parts).disposer) {
      pSVar1 = (this->parts).ptr;
      newSize = 4;
      if (pSVar5 != pSVar1) {
        newSize = ((long)pSVar5 - (long)pSVar1 >> 3) * 0x5555555555555556;
      }
      Vector<kj::String>::setCapacity((Vector<kj::String> *)this,newSize);
      pSVar5 = (String *)(this->parts).size_;
    }
    (pSVar5->content).ptr = (char *)f.exception;
    (pSVar5->content).size_ = (size_t)pEStack_a0;
    (pSVar5->content).disposer = local_98;
    (this->parts).size_ = (size_t)(pSVar5 + 1);
  }
  return;
}

Assistant:

void Path::evalPart(Vector<String>& parts, ArrayPtr<const char> part) {
  if (part.size() == 0) {
    // Ignore consecutive or trailing '/'s.
  } else if (part.size() == 1 && part[0] == '.') {
    // Refers to current directory; ignore.
  } else if (part.size() == 2 && part[0] == '.' && part [1] == '.') {
    KJ_REQUIRE(parts.size() > 0, "can't use \"..\" to break out of starting directory") {
      // When exceptions are disabled, ignore.
      return;
    }
    parts.removeLast();
  } else {
    auto str = heapString(part);
    KJ_REQUIRE(strlen(str.begin()) == str.size(), "NUL character in path component", str) {
      // When exceptions are disabled, strip out '\0' chars.
      str = stripNul(kj::mv(str));
      break;
    }
    parts.add(kj::mv(str));
  }
}